

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall el::base::Storage::~Storage(Storage *this)

{
  Storage *this_local;
  
  ~Storage(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Storage(void) {
        ELPP_INTERNAL_INFO(4, "Destroying storage");
#if ELPP_ASYNC_LOGGING
        ELPP_INTERNAL_INFO(5, "Replacing log dispatch callback to synchronous");
        uninstallLogDispatchCallback<base::AsyncLogDispatchCallback>(std::string("AsyncLogDispatchCallback"));
        installLogDispatchCallback<base::DefaultLogDispatchCallback>(std::string("DefaultLogDispatchCallback"));
        ELPP_INTERNAL_INFO(5, "Destroying asyncDispatchWorker");
        base::utils::safeDelete(m_asyncDispatchWorker);
        ELPP_INTERNAL_INFO(5, "Destroying asyncLogQueue");
        base::utils::safeDelete(m_asyncLogQueue);
#endif  // ELPP_ASYNC_LOGGING
        ELPP_INTERNAL_INFO(5, "Destroying registeredHitCounters");
        base::utils::safeDelete(m_registeredHitCounters);
        ELPP_INTERNAL_INFO(5, "Destroying registeredLoggers");
        base::utils::safeDelete(m_registeredLoggers);
        ELPP_INTERNAL_INFO(5, "Destroying vRegistry");
        base::utils::safeDelete(m_vRegistry);
    }